

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::expandArguments
          (HlslParseContext *this,TSourceLoc *loc,TFunction *function,TIntermTyped **arguments)

{
  void *__dest;
  TType *type;
  void *pvVar1;
  undefined8 *puVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermTyped *pTVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar11;
  long *plVar12;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TIntermAggregate *pTVar13;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *pvVar17;
  undefined8 *puVar14;
  int iVar15;
  ulong uVar16;
  void *__src;
  TVector<glslang::TIntermTyped_*> memberArgs;
  TIntermAggregate *aggregate;
  TPoolAllocator *local_78;
  undefined8 *puStack_70;
  undefined8 *local_68;
  undefined8 uStack_60;
  TIntermTyped **local_50;
  TSourceLoc *local_48;
  TIntermTyped *local_40;
  TIntermAggregate *local_38;
  TIntermAggregate *pTVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_04;
  
  local_48 = loc;
  iVar5 = (*((*arguments)->super_TIntermNode)._vptr_TIntermNode[6])();
  pTVar9 = (TIntermAggregate *)CONCAT44(extraout_var,iVar5);
  local_38 = pTVar9;
  iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (0 < iVar5) {
    uVar16 = 0;
    iVar5 = 0;
    local_50 = arguments;
    do {
      iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      iVar15 = (int)uVar16;
      if ((iVar6 == 1) || (pTVar9 == (TIntermAggregate *)0x0)) {
        pTVar10 = *arguments;
      }
      else {
        iVar6 = (*(pTVar9->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(pTVar9);
        pTVar10 = *(TIntermTyped **)
                   (*(long *)(CONCAT44(extraout_var_00,iVar6) + 8) + (long)(iVar5 + iVar15) * 8);
      }
      iVar6 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[3])();
      pTVar10 = (TIntermTyped *)CONCAT44(extraout_var_01,iVar6);
      bVar3 = wasFlattened(this,pTVar10);
      if (bVar3) {
        iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar16);
        type = *(TType **)(CONCAT44(extraout_var_02,iVar6) + 8);
        iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar16);
        lVar11 = (**(code **)(**(long **)(CONCAT44(extraout_var_03,iVar6) + 8) + 0x50))();
        bVar3 = shouldFlatten(this,type,*(TStorageQualifier *)(lVar11 + 8) & 0x7f,true);
        if (bVar3) {
          local_68 = (undefined8 *)0x0;
          uStack_60 = 0;
          local_78 = (TPoolAllocator *)0x0;
          puStack_70 = (undefined8 *)0x0;
          local_78 = GetThreadPoolAllocator();
          puStack_70 = (undefined8 *)0x0;
          local_68 = (undefined8 *)0x0;
          uStack_60 = 0;
          iVar6 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar10);
          plVar12 = (long *)CONCAT44(extraout_var_04,iVar6);
          cVar4 = (**(code **)(*plVar12 + 0x128))(plVar12);
          if (cVar4 == '\0') {
LAB_003922af:
            __assert_fail("isStruct()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                          ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
          }
          iVar6 = 0;
          while (arguments = local_50,
                iVar6 < (int)((ulong)(*(long *)(plVar12[0xd] + 0x10) - *(long *)(plVar12[0xd] + 8))
                             >> 5)) {
            local_40 = flattenAccess(this,pTVar10,iVar6);
            std::vector<glslang::TIntermTyped*,glslang::pool_allocator<glslang::TIntermTyped*>>::
            emplace_back<glslang::TIntermTyped*>
                      ((vector<glslang::TIntermTyped*,glslang::pool_allocator<glslang::TIntermTyped*>>
                        *)&local_78,&local_40);
            iVar6 = iVar6 + 1;
            iVar7 = (*(pTVar10->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar10);
            plVar12 = (long *)CONCAT44(extraout_var_05,iVar7);
            cVar4 = (**(code **)(*plVar12 + 0x128))(plVar12);
            if (cVar4 == '\0') goto LAB_003922af;
          }
          iVar6 = iVar15 + iVar5;
          if ((long)local_68 - (long)puStack_70 == 8) {
            pTVar10 = (TIntermTyped *)*puStack_70;
            iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
            arguments = local_50;
            if ((iVar7 + iVar5 == 1) || (pTVar9 == (TIntermAggregate *)0x0)) {
              *local_50 = pTVar10;
            }
            else {
              iVar7 = (*(pTVar9->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0x32])();
              *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_06,iVar7) + 8) + (long)iVar6 * 8) =
                   pTVar10;
            }
          }
          else if (8 < (ulong)((long)local_68 - (long)puStack_70)) {
            iVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
            if (iVar7 + iVar5 == 1) {
              pTVar13 = TIntermediate::makeAggregate
                                  ((this->super_TParseContextBase).super_TParseVersions.intermediate
                                   ,(TIntermNode *)*puStack_70);
              puVar2 = local_68;
              *arguments = (TIntermTyped *)pTVar13;
              puVar14 = puStack_70;
              while (puVar14 = puVar14 + 1, puVar14 != puVar2) {
                pTVar13 = TIntermediate::growAggregate
                                    ((this->super_TParseContextBase).super_TParseVersions.
                                     intermediate,&(*arguments)->super_TIntermNode,
                                     (TIntermNode *)*puVar14);
                *arguments = (TIntermTyped *)pTVar13;
              }
            }
            else {
              iVar7 = (*(pTVar9->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0x32])(pTVar9);
              iVar8 = (*(pTVar9->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0x32])(pTVar9);
              lVar11 = *(long *)(CONCAT44(extraout_var_08,iVar8) + 8);
              __dest = (void *)(lVar11 + (long)iVar6 * 8);
              __src = (void *)(lVar11 + (long)iVar6 * 8 + 8);
              pvVar1 = *(void **)(CONCAT44(extraout_var_07,iVar7) + 0x10);
              if (__src != pvVar1) {
                memmove(__dest,__src,(long)pvVar1 - (long)__src);
              }
              plVar12 = (long *)(CONCAT44(extraout_var_07,iVar7) + 0x10);
              *plVar12 = *plVar12 + -8;
              pvVar17._0_4_ =
                   (vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                   (*(pTVar9->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                     _vptr_TIntermNode[0x32])();
              std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<glslang::TIntermTyped*const*,std::vector<glslang::TIntermTyped*,glslang::pool_allocator<glslang::TIntermTyped*>>>>
                        (pvVar17._0_4_,__dest,puStack_70,local_68);
            }
            iVar5 = iVar5 + (int)((ulong)((long)local_68 - (long)puStack_70) >> 3) + -1;
          }
        }
      }
      uVar16 = (ulong)(iVar15 + 1U);
      iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    } while ((int)(iVar15 + 1U) < iVar6);
  }
  if (pTVar9 != (TIntermAggregate *)0x0) {
    addStructBuffArguments(this,local_48,&local_38);
  }
  return;
}

Assistant:

void HlslParseContext::expandArguments(const TSourceLoc& loc, const TFunction& function, TIntermTyped*& arguments)
{
    TIntermAggregate* aggregate = arguments->getAsAggregate();
    int functionParamNumberOffset = 0;

    // Replace a single argument with a single argument.
    const auto setArg = [&](int paramNum, TIntermTyped* arg) {
        if (function.getParamCount() + functionParamNumberOffset == 1)
            arguments = arg;
        else {
            if (aggregate == nullptr)
                arguments = arg;
            else
                aggregate->getSequence()[paramNum] = arg;
        }
    };

    // Replace a single argument with a list of arguments
    const auto setArgList = [&](int paramNum, const TVector<TIntermTyped*>& args) {
        if (args.size() == 1)
            setArg(paramNum, args.front());
        else if (args.size() > 1) {
            if (function.getParamCount() + functionParamNumberOffset == 1) {
                arguments = intermediate.makeAggregate(args.front());
                std::for_each(args.begin() + 1, args.end(),
                    [&](TIntermTyped* arg) {
                        arguments = intermediate.growAggregate(arguments, arg);
                    });
            } else {
                auto it = aggregate->getSequence().erase(aggregate->getSequence().begin() + paramNum);
                aggregate->getSequence().insert(it, args.begin(), args.end());
            }
            functionParamNumberOffset += (int)(args.size() - 1);
        }
    };

    // Process each argument's conversion
    for (int param = 0; param < function.getParamCount(); ++param) {
        // At this early point there is a slight ambiguity between whether an aggregate 'arguments'
        // is the single argument itself or its children are the arguments.  Only one argument
        // means take 'arguments' itself as the one argument.
        TIntermTyped* arg = function.getParamCount() == 1
                                   ? arguments->getAsTyped()
                                   : (aggregate ?
                                        aggregate->getSequence()[param + functionParamNumberOffset]->getAsTyped() :
                                        arguments->getAsTyped());

        if (wasFlattened(arg) && shouldFlatten(*function[param].type, function[param].type->getQualifier().storage, true)) {
            // Need to pass the structure members instead of the structure.
            TVector<TIntermTyped*> memberArgs;
            for (int memb = 0; memb < (int)arg->getType().getStruct()->size(); ++memb)
                memberArgs.push_back(flattenAccess(arg, memb));
            setArgList(param + functionParamNumberOffset, memberArgs);
        }
    }

    // TODO: if we need both hidden counter args (below) and struct expansion (above)
    // the two algorithms need to be merged: Each assumes the list starts out 1:1 between
    // parameters and arguments.

    // If any argument is a pass-by-reference struct buffer with an associated counter
    // buffer, we have to add another hidden parameter for that counter.
    if (aggregate)
        addStructBuffArguments(loc, aggregate);
}